

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68k-dis.c
# Opt level: O0

int fetch_data(disassemble_info *info,bfd_byte *addr)

{
  undefined8 *puVar1;
  bfd_vma bVar2;
  int iVar3;
  bfd_vma start;
  private *priv;
  int status;
  bfd_byte *addr_local;
  disassemble_info *info_local;
  
  puVar1 = (undefined8 *)info->private_data;
  bVar2 = *(int *)(puVar1 + 4) + ((int)*puVar1 - ((int)puVar1 + 8));
  iVar3 = (*info->read_memory_func)(bVar2,(bfd_byte *)*puVar1,(int)addr - (int)*puVar1,info);
  if (iVar3 == 0) {
    *puVar1 = addr;
  }
  else {
    (*info->memory_error_func)(iVar3,bVar2,info);
  }
  info_local._4_4_ = (uint)(iVar3 == 0);
  return info_local._4_4_;
}

Assistant:

static int
fetch_data (struct disassemble_info *info, bfd_byte *addr)
{
  int status;
  struct private *priv = (struct private *)info->private_data;
  bfd_vma start = priv->insn_start + (priv->max_fetched - priv->the_buffer);

  status = (*info->read_memory_func) (start,
				      priv->max_fetched,
				      addr - priv->max_fetched,
				      info);
  if (status != 0)
    {
      (*info->memory_error_func) (status, start, info);
      return 0;
    }
  else
    priv->max_fetched = addr;
  return 1;
}